

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O2

int AF_A_JumpIfInTargetLOS(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  bool bVar2;
  AActor *other;
  uint uVar3;
  uint uVar4;
  void *val;
  char *pcVar5;
  long lVar6;
  AActor *this;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_50;
  _func_int **local_38;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_005c02ac;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_005c029c:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_005c02ac:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x11b5,
                  "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_005bfe8d;
    bVar2 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005c02ac;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_005c029c;
LAB_005bfe8d:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_005c02cb:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x11b6,
                  "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((param[1].field_0.field_3.Type != '\x03') ||
     (val = param[1].field_0.field_1.a, val != (void *)0x0 && param[1].field_0.field_1.atag != 7)) {
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
    ;
    goto LAB_005c02cb;
  }
  uVar3 = 0;
  if ((uint)numparam < 3) {
    dVar7 = 0.0;
LAB_005bff27:
    local_50 = 0.0;
    dVar9 = 0.0;
LAB_005bff2b:
    lVar6 = 0x1d8;
    if (((((this->flags).Value & 0x10000) == 0) || ((uVar3 & 1) == 0)) ||
       (lVar6 = 0x248, ((this->flags2).Value & 0x40000000) != 0)) goto LAB_005c003c;
LAB_005c00bc:
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x11d0,
                    "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  else {
    VVar1 = param[2].field_0.field_3.Type;
    if (VVar1 == '\x01') {
      dVar7 = param[2].field_0.f;
    }
    else {
      dVar7 = 0.0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11b7,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    if (numparam == 3) goto LAB_005bff27;
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\0') {
      uVar3 = param[3].field_0.i;
    }
    else {
      uVar3 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11b8,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    dVar9 = 0.0;
    local_50 = 0.0;
    if (4 < (uint)numparam) {
      VVar1 = param[4].field_0.field_3.Type;
      if (VVar1 == '\x01') {
        dVar9 = param[4].field_0.f;
      }
      else if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11b9,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      local_50 = 0.0;
      if (numparam != 5) {
        VVar1 = param[5].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          local_50 = param[5].field_0.f;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x11ba,
                        "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
    }
    lVar6 = 0x250;
    if ((uVar3 & 0x40) == 0) goto LAB_005bff2b;
LAB_005c003c:
    other = GC::ReadBarrier<AActor>
                      ((AActor **)
                       ((long)&(this->super_DThinker).super_DObject._vptr_DObject + lVar6));
    if (other == (AActor *)0x0) goto LAB_005c00bc;
    if (((uVar3 & 0x20) == 0) || (0 < other->health)) {
      dVar8 = AActor::Distance3D(this,other,false);
      if (((dVar9 == 0.0) && (!NAN(dVar9))) || (dVar8 <= dVar9)) {
        uVar4 = uVar3 & 2;
        if (((local_50 != 0.0) || (NAN(local_50))) && (dVar8 < local_50)) {
          if ((uVar3 & 0x10) != 0) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                            ,0x11e5,
                            "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
            goto LAB_005c00d4;
          }
          if ((uVar3 & 4) != 0) {
            dVar7 = 0.0;
          }
          uVar4 = uVar3 & 10;
        }
        if (((dVar7 <= 0.0) || (360.0 <= dVar7)) ||
           (AActor::AngleTo((AActor *)&stack0xffffffffffffffc8,other,SUB81(this,0)),
           ABS((double)SUB84(((double)local_38 - (other->Angles).Yaw.Degrees) * 11930464.711111112 +
                             6755399441055744.0,0) * 8.381903171539307e-08) <= dVar7 * 0.5)) {
          if ((uVar4 == 0) && (bVar2 = P_CheckSight(other,this,1), !bVar2)) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                            ,0x11f9,
                            "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetPointer(ret,(void *)0x0,7);
            return 1;
          }
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x11fb,
                          "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
          goto LAB_005c00d6;
        }
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x11f4,
                        "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      else {
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x11dc,
                        "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
    }
    else {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x11d5,
                      "int AF_A_JumpIfInTargetLOS(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
  }
LAB_005c00d4:
  val = (void *)0x0;
LAB_005c00d6:
  VMReturn::SetPointer(ret,val,7);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfInTargetLOS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STATE		(jump);
	PARAM_ANGLE_OPT	(fov)			{ fov = 0.; }
	PARAM_INT_OPT	(flags)			{ flags = 0; }
	PARAM_FLOAT_OPT	(dist_max)		{ dist_max = 0; }
	PARAM_FLOAT_OPT	(dist_close)	{ dist_close = 0; }

	AActor *target;

	if (flags & JLOSF_CHECKMASTER)
	{
		target = self->master;
	}
	else if (self->flags & MF_MISSILE && (flags & JLOSF_PROJECTILE))
	{
		if (self->flags2 & MF2_SEEKERMISSILE)
			target = self->tracer;
		else
			target = NULL;
	}
	else
	{
		target = self->target;
	}

	if (target == NULL)
	{ // [KS] Let's not call P_CheckSight unnecessarily in this case.
		ACTION_RETURN_STATE(NULL);
	}

	if ((flags & JLOSF_DEADNOJUMP) && (target->health <= 0))
	{
		ACTION_RETURN_STATE(NULL);
	}

	double distance = self->Distance3D(target);

	if (dist_max && (distance > dist_max))
	{
		ACTION_RETURN_STATE(NULL);
	}

	bool doCheckSight = !(flags & JLOSF_NOSIGHT);

	if (dist_close && (distance < dist_close))
	{
		if (flags & JLOSF_CLOSENOJUMP)
		{
			ACTION_RETURN_STATE(NULL);
		}
		if (flags & JLOSF_CLOSENOFOV)
			fov = 0.;

		if (flags & JLOSF_CLOSENOSIGHT)
			doCheckSight = false;
	}

	if (fov > 0 && (fov < 360.))
	{
		DAngle an = absangle(target->AngleTo(self), target->Angles.Yaw);

		if (an > (fov / 2))
		{
			ACTION_RETURN_STATE(NULL); // [KS] Outside of FOV - return
		}
	}
	if (doCheckSight && !P_CheckSight (target, self, SF_IGNOREVISIBILITY))
	{
		ACTION_RETURN_STATE(NULL);
	}
	ACTION_RETURN_STATE(jump);
}